

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void mpp_sthd_grp_put(MppSThdGrp grp)

{
  MppSThdImpl *thd;
  RK_S32 i;
  MppSThdGrpImpl *impl;
  MppSThdGrp grp_local;
  
  if ((grp == (MppSThdGrp)0x0) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl",
                 "mpp_sthd_grp_put",0x212), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (((*(int *)((long)grp + 0x14) != 0) && (*(int *)((long)grp + 0x14) != 1)) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "impl->status == MPP_STHD_UNINITED || impl->status == MPP_STHD_READY",
                 "mpp_sthd_grp_put",0x213), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  for (thd._4_4_ = 0; thd._4_4_ < *(int *)((long)grp + 0x10); thd._4_4_ = thd._4_4_ + 1) {
    mpp_sthd_deinit((MppSThdImpl *)((long)grp + (long)thd._4_4_ * 0x88 + 0x40));
  }
  mpp_osal_free("mpp_sthd_grp_put",grp);
  return;
}

Assistant:

void mpp_sthd_grp_put(MppSThdGrp grp)
{
    MppSThdGrpImpl *impl = (MppSThdGrpImpl *)grp;
    RK_S32 i;

    mpp_assert(impl);
    mpp_assert(impl->status == MPP_STHD_UNINITED || impl->status == MPP_STHD_READY);

    for (i = 0; i < impl->count; i++) {
        MppSThdImpl *thd = &impl->thds[i];

        mpp_sthd_deinit(thd);
    }

    mpp_free(impl);
}